

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButtonPrivate::popupTimerDone(QToolButtonPrivate *this)

{
  QWidget *parent;
  Data *pDVar1;
  void **ppvVar2;
  int *piVar3;
  QObject *pQVar4;
  PositionFunction positionFunction;
  bool bVar5;
  bool bVar6;
  Orientation OVar7;
  long lVar8;
  QWidget *pQVar9;
  _Manager_type p_Var10;
  QToolBar *this_00;
  int *piVar11;
  undefined4 *puVar12;
  undefined8 uVar13;
  ulong uVar14;
  QWidget *pQVar15;
  QWidget *pQVar16;
  QWidget *pQVar17;
  long in_FS_OFFSET;
  byte bVar18;
  undefined1 in_stack_ffffffffffffff28 [15];
  byte bVar19;
  QWidget *local_98;
  byte local_90;
  undefined4 local_8f;
  undefined3 uStack_8b;
  code *local_88;
  code *local_80;
  QPoint initialPos;
  QArrayDataPointer<QAction_*> local_70;
  QObject local_58 [8];
  QObject local_50 [8];
  code *local_48;
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  QBasicTimer::stop();
  if (((this->field_0x2ec & 4) == 0) &&
     (((this->super_QAbstractButtonPrivate).field_0x28c & 0x10) == 0)) goto LAB_004bb17d;
  this->field_0x2ec = this->field_0x2ec | 4;
  pDVar1 = (this->menuAction).wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     ((this->menuAction).wp.value == (QObject *)0x0 || *(int *)(pDVar1 + 4) == 0)) {
    if (this->defaultAction != (QAction *)0x0) {
      QAction::menuObject();
      lVar8 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar8 != 0) goto LAB_004bac54;
    }
    pQVar9 = (QWidget *)operator_new(0x28);
    QMenu::QMenu((QMenu *)pQVar9,parent);
    p_Var10 = (_Manager_type)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar9);
    bVar5 = true;
    if ((this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.size != 0) {
      uVar14 = 0;
      do {
        QWidget::addAction(pQVar9,(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.
                                  d.ptr[uVar14]);
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.
                               size);
      bVar5 = true;
    }
  }
  else {
LAB_004bac54:
    QAction::menuObject();
    pQVar9 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (pQVar9 == (QWidget *)0x0) {
      pQVar9 = (QWidget *)0x0;
      p_Var10 = (_Manager_type)0x0;
    }
    else {
      p_Var10 = (_Manager_type)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar9);
    }
    bVar5 = false;
  }
  bVar6 = QAbstractButton::autoRepeat((QAbstractButton *)parent);
  this->field_0x2ec = this->field_0x2ec & 0xef | bVar6 << 4;
  QAbstractButton::setAutoRepeat((QAbstractButton *)parent,false);
  this_00 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if (this_00 == (QToolBar *)0x0) {
    bVar18 = true;
  }
  else {
    OVar7 = QToolBar::orientation(this_00);
    bVar18 = OVar7 != Vertical;
  }
  piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&parent->super_QObject);
  pQVar16 = pQVar9;
  if (p_Var10 == (_Manager_type)0x0) {
    QMenu::setNoReplayFor((QMenu *)0x0,parent);
    pQVar15 = (QWidget *)0x0;
    pQVar17 = (QWidget *)0x0;
    if (!bVar5) goto LAB_004bad9d;
  }
  else {
    QMenu::setNoReplayFor((QMenu *)pQVar9,parent);
    if (!bVar5) {
      pQVar17 = (QWidget *)0x0;
      if (*(int *)(p_Var10 + 4) != 0) {
        pQVar17 = pQVar9;
      }
LAB_004bad9d:
      pQVar9 = pQVar16;
      local_70.d = (Data *)QMenu::triggered;
      local_70.ptr = (QAction **)0x0;
      local_48 = onMenuTriggered;
      local_40 = (ImplFn)0x0;
      ppvVar2 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
      puVar12 = (undefined4 *)operator_new(0x20);
      *puVar12 = 1;
      *(code **)(puVar12 + 2) =
           QtPrivate::
           QPrivateSlotObject<void_(QToolButtonPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>
           ::impl;
      *(code **)(puVar12 + 4) = onMenuTriggered;
      *(undefined8 *)(puVar12 + 6) = 0;
      QObject::connectImpl
                (local_50,(void **)pQVar17,(QObject *)&local_70,ppvVar2,(QSlotObjectBase *)&local_48
                 ,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection((Connection *)local_50);
      pQVar15 = (QWidget *)0x0;
      pQVar16 = pQVar9;
      if (p_Var10 == (_Manager_type)0x0) goto LAB_004bae48;
    }
    pQVar15 = (QWidget *)0x0;
    if (*(int *)(p_Var10 + 4) != 0) {
      pQVar15 = pQVar9;
    }
  }
LAB_004bae48:
  local_70.d = (Data *)QMenu::aboutToHide;
  local_70.ptr = (QAction **)0x0;
  local_48 = updateButtonDown;
  local_40 = (ImplFn)0x0;
  ppvVar2 = *(void ***)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QToolButtonPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar12 + 4) = updateButtonDown;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar15,(QObject *)&local_70,ppvVar2,(QSlotObjectBase *)&local_48,
             (ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  lVar8 = *(long *)&pQVar9->field_0x8;
  uVar13 = QtSharedPointer::ExternalRefCountData::getAndRef(&parent->super_QObject);
  piVar3 = *(int **)(lVar8 + 0x2f8);
  *(undefined8 *)(lVar8 + 0x2f8) = uVar13;
  *(QWidget **)(lVar8 + 0x300) = parent;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  pQVar4 = (QObject *)this->defaultAction;
  lVar8 = *(long *)&pQVar16->field_0x8;
  if (pQVar4 == (QObject *)0x0) {
    uVar13 = 0;
  }
  else {
    uVar13 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
  }
  piVar3 = *(int **)(lVar8 + 0x308);
  *(undefined8 *)(lVar8 + 0x308) = uVar13;
  *(QObject **)(lVar8 + 0x310) = pQVar4;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  QWidget::actions((QList<QAction_*> *)&local_70,parent);
  QArrayDataPointer<QAction_*>::operator=(&(this->actionsCopy).d,&local_70);
  if (&(local_70.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d)->super_QArrayData,8,0x10);
    }
  }
  initialPos = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = pQVar16;
  local_70.d = (Data *)(**(code **)(*(long *)pQVar16 + 0x70))(pQVar16);
  bVar19 = bVar18;
  initialPos = popupTimerDone::anon_class_16_2_6d8a6aca::operator()
                         ((anon_class_16_2_6d8a6aca *)parent,(QSize *)(ulong)bVar18);
  local_8f = 0xaaaaaaaa;
  uStack_8b = 0xaaaaaa;
  local_80 = std::
             _Function_handler<QPoint_(const_QSize_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtoolbutton.cpp:781:29)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<QPoint_(const_QSize_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qtoolbutton.cpp:781:29)>
             ::_M_manager;
  positionFunction.super__Function_base._M_functor._M_pod_data[0xf] = bVar19;
  positionFunction.super__Function_base._M_functor._0_15_ = in_stack_ffffffffffffff28;
  positionFunction.super__Function_base._M_manager = p_Var10;
  positionFunction._M_invoker = (_Invoker_type)pQVar9;
  local_98 = parent;
  local_90 = bVar18;
  QMenuPrivate::exec(*(QMenuPrivate **)&pQVar16->field_0x8,&initialPos,(QAction *)0x0,
                     positionFunction);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  if (piVar11 != (int *)0x0) {
    if (piVar11[1] != 0) {
      pQVar16 = pQVar9;
      if (*(int *)(p_Var10 + 4) == 0) {
        pQVar16 = (QWidget *)0x0;
      }
      local_70.d = (Data *)QMenu::aboutToHide;
      local_70.ptr = (QAction **)0x0;
      local_48 = updateButtonDown;
      local_40 = (ImplFn)0x0;
      QObject::disconnectImpl
                (&pQVar16->super_QObject,&local_70.d,
                 *(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8,
                 &local_48,&QMenu::staticMetaObject);
      if ((this->field_0x2ec & 4) != 0) {
        updateButtonDown(this);
      }
      if (bVar5) {
        if (*(int *)(p_Var10 + 4) != 0) {
          (**(code **)(*(long *)pQVar9 + 0x20))(pQVar9);
        }
      }
      else {
        if (*(int *)(p_Var10 + 4) == 0) {
          pQVar9 = (QWidget *)0x0;
        }
        local_70.d = (Data *)QMenu::triggered;
        local_70.ptr = (QAction **)0x0;
        local_48 = onMenuTriggered;
        local_40 = (ImplFn)0x0;
        QObject::disconnectImpl
                  (&pQVar9->super_QObject,&local_70.d,
                   *(QObject **)&(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.field_0x8
                   ,&local_48,&QMenu::staticMetaObject);
      }
      QList<QAction_*>::clear(&this->actionsCopy);
      if ((this->field_0x2ec & 0x10) != 0) {
        QAbstractButton::setAutoRepeat((QAbstractButton *)parent,true);
      }
    }
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      operator_delete(piVar11);
    }
  }
  LOCK();
  *(int *)p_Var10 = *(int *)p_Var10 + -1;
  UNLOCK();
  if (*(int *)p_Var10 == 0) {
    operator_delete(p_Var10);
  }
LAB_004bb17d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolButtonPrivate::popupTimerDone()
{
    Q_Q(QToolButton);
    popupTimer.stop();
    if (!menuButtonDown && !down)
        return;

    menuButtonDown = true;
    QPointer<QMenu> actualMenu;
    bool mustDeleteActualMenu = false;
    if (menuAction) {
        actualMenu = menuAction->menu();
    } else if (defaultAction && defaultAction->menu()) {
        actualMenu = defaultAction->menu();
    } else {
        actualMenu = new QMenu(q);
        mustDeleteActualMenu = true;
        for (int i = 0; i < actions.size(); i++)
            actualMenu->addAction(actions.at(i));
    }
    repeat = q->autoRepeat();
    q->setAutoRepeat(false);
    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif
    QPointer<QToolButton> that = q;
    actualMenu->setNoReplayFor(q);
    if (!mustDeleteActualMenu) { //only if action are not in this widget
        QObjectPrivate::connect(actualMenu, &QMenu::triggered,
                                this, &QToolButtonPrivate::onMenuTriggered);
    }
    QObjectPrivate::connect(actualMenu, &QMenu::aboutToHide,
                            this, &QToolButtonPrivate::updateButtonDown);
    actualMenu->d_func()->causedPopup.widget = q;
    actualMenu->d_func()->causedPopup.action = defaultAction;
    actionsCopy = q->actions(); //(the list of action may be modified in slots)

    // QTBUG-78966, Delay positioning until after aboutToShow().
    auto positionFunction = [q, horizontal](const QSize &sizeHint) {
        return positionMenu(q, horizontal, sizeHint); };
    const auto initialPos = positionFunction(actualMenu->sizeHint());
    actualMenu->d_func()->exec(initialPos, nullptr, positionFunction);

    if (!that)
        return;

    QObjectPrivate::disconnect(actualMenu, &QMenu::aboutToHide,
                               this, &QToolButtonPrivate::updateButtonDown);
    if (menuButtonDown) {
        // The menu was empty, it didn't actually show up, so it was never hidden either
        updateButtonDown();
    }

    if (mustDeleteActualMenu) {
        delete actualMenu;
    } else {
        QObjectPrivate::disconnect(actualMenu, &QMenu::triggered,
                                   this, &QToolButtonPrivate::onMenuTriggered);
    }

    actionsCopy.clear();

    if (repeat)
        q->setAutoRepeat(true);
}